

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rootindexproxymodel.cpp
# Opt level: O0

void RootIndexProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  void *_v_1;
  RootIndexProxyModel *_t_2;
  quintptr local_50;
  QAbstractItemModel *local_48;
  undefined8 *local_40;
  void *_v;
  RootIndexProxyModel *_t_1;
  int *result;
  RootIndexProxyModel *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (RootIndexProxyModel *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      result = (int *)_o;
      rootIndexChanged((RootIndexProxyModel *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == rootIndexChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == ReadProperty) {
    local_40 = (undefined8 *)*_a;
    if (_id == 0) {
      _v = _o;
      rootIndex((QModelIndex *)&_t_2,(RootIndexProxyModel *)_o);
      *local_40 = _t_2;
      local_40[1] = local_50;
      local_40[2] = local_48;
    }
  }
  else if ((_c == WriteProperty) && (_id == 0)) {
    setRootIndex((RootIndexProxyModel *)_o,(QModelIndex *)*_a);
  }
  return;
}

Assistant:

void RootIndexProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<RootIndexProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->rootIndexChanged(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (RootIndexProxyModel::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RootIndexProxyModel::rootIndexChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<RootIndexProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QModelIndex*>(_v) = _t->rootIndex(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<RootIndexProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRootIndex(*reinterpret_cast< QModelIndex*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_a;
}